

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint16 crnlib::etc1_block::pack_delta3(int r,int g,int b)

{
  undefined4 local_14;
  undefined4 local_10;
  int b_local;
  int g_local;
  int r_local;
  
  b_local = r;
  if (r < 0) {
    b_local = r + 8;
  }
  local_10 = g;
  if (g < 0) {
    local_10 = g + 8;
  }
  local_14 = b;
  if (b < 0) {
    local_14 = b + 8;
  }
  return (ushort)local_14 | (ushort)(local_10 << 3) | (ushort)(b_local << 6);
}

Assistant:

uint16 etc1_block::pack_delta3(int r, int g, int b)
    {
        CRNLIB_ASSERT((r >= cETC1ColorDeltaMin) && (r <= cETC1ColorDeltaMax));
        CRNLIB_ASSERT((g >= cETC1ColorDeltaMin) && (g <= cETC1ColorDeltaMax));
        CRNLIB_ASSERT((b >= cETC1ColorDeltaMin) && (b <= cETC1ColorDeltaMax));
        if (r < 0)
        {
            r += 8;
        }
        if (g < 0)
        {
            g += 8;
        }
        if (b < 0)
        {
            b += 8;
        }
        return static_cast<uint16>(b | (g << 3) | (r << 6));
    }